

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O1

void __thiscall TCV::TCV(TCV *this,ASTNode *root,STGV *_stgv)

{
  Detector *pDVar1;
  ASTNode *pAVar2;
  
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR_visit_0014dae8;
  this->shouldReturn = false;
  this->didReturn = false;
  (this->returnType)._M_dataplus._M_p = (pointer)&(this->returnType).field_2;
  (this->returnType)._M_string_length = 0;
  (this->returnType).field_2._M_local_buf[0] = '\0';
  (this->currentFuncName)._M_dataplus._M_p = (pointer)&(this->currentFuncName).field_2;
  (this->currentFuncName)._M_string_length = 0;
  (this->currentFuncName).field_2._M_local_buf[0] = '\0';
  (this->currentNamespace)._M_dataplus._M_p = (pointer)&(this->currentNamespace).field_2;
  (this->currentNamespace)._M_string_length = 0;
  (this->currentNamespace).field_2._M_local_buf[0] = '\0';
  this->stgv = _stgv;
  this->symbolTable = _stgv->symbolTable;
  pDVar1 = (Detector *)operator_new(0x48);
  (pDVar1->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar1->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar1->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar1->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar1->memSizeCalculator = (MemSizeCalculator *)0x0;
  (pDVar1->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pDVar1->symbolTable = (SymbolTable *)0x0;
  pDVar1->dependencyGraph = (DependencyGraph *)0x0;
  (pDVar1->warnings).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->detector = pDVar1;
  pAVar2 = AST::ASTNode::getChild(root,0);
  (**pAVar2->_vptr_ASTNode)(pAVar2,this);
  return;
}

Assistant:

TCV::TCV(AST::ASTNode *root, STGV *_stgv) {
    this->stgv = _stgv;
    this->symbolTable = _stgv->symbolTable;
    this->detector = new Semantic::Detector();
    root->getChild(0)->accept(*this);
}